

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

BasicBlock * __thiscall spvtools::opt::Loop::FindLatchBlock(Loop *this)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t a;
  CFG *this_01;
  Function *f;
  DominatorAnalysis *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  reference puVar3;
  BasicBlock *pBVar4;
  const_iterator cStack_38;
  uint32_t block_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  DominatorAnalysis *dominator_analysis;
  CFG *cfg;
  Loop *this_local;
  
  this_01 = IRContext::cfg(this->context_);
  this_00 = this->context_;
  f = BasicBlock::GetParent(this->loop_header_);
  this_02 = IRContext::GetDominatorAnalysis(this_00,f);
  uVar2 = BasicBlock::id(this->loop_header_);
  this_03 = CFG::preds(this_01,uVar2);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_03);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_03);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
    if (!bVar1) {
      __assert_fail("false && \"Every loop should have a latch block dominated by the continue target\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x15c,"BasicBlock *spvtools::opt::Loop::FindLatchBlock()");
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar2 = *puVar3;
    a = BasicBlock::id(this->loop_continue_);
    bVar1 = DominatorAnalysisBase::Dominates(&this_02->super_DominatorAnalysisBase,a,uVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  pBVar4 = CFG::block(this_01,uVar2);
  return pBVar4;
}

Assistant:

BasicBlock* Loop::FindLatchBlock() {
  CFG* cfg = context_->cfg();

  DominatorAnalysis* dominator_analysis =
      context_->GetDominatorAnalysis(loop_header_->GetParent());

  // Look at the predecessors of the loop header to find a predecessor block
  // which is dominated by the loop continue target. There should only be one
  // block which meets this criteria and this is the latch block, as per the
  // SPIR-V spec.
  for (uint32_t block_id : cfg->preds(loop_header_->id())) {
    if (dominator_analysis->Dominates(loop_continue_->id(), block_id)) {
      return cfg->block(block_id);
    }
  }

  assert(
      false &&
      "Every loop should have a latch block dominated by the continue target");
  return nullptr;
}